

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

void __thiscall CCharmapToUni::load_table(CCharmapToUni *this,osfildef *fp)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uchar buf [256];
  ushort local_138 [132];
  
  sVar1 = fread(local_138,6,1,(FILE *)fp);
  if (sVar1 == 1) {
    uVar2 = (uint)local_138[2];
    do {
      if (uVar2 == 0) {
        return;
      }
      uVar3 = 0x40;
      if (uVar2 < 0x40) {
        uVar3 = (ulong)uVar2;
      }
      sVar1 = fread(local_138,(ulong)(uint)((int)uVar3 * 4),1,(FILE *)fp);
      if (sVar1 == 1) {
        uVar4 = 0;
        do {
          (*(this->super_CCharmap)._vptr_CCharmap[7])
                    (this,(ulong)local_138[uVar4 * 2],(ulong)local_138[uVar4 * 2 + 1]);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        uVar2 = uVar2 - (int)uVar3;
      }
    } while (sVar1 == 1);
  }
  return;
}

Assistant:

void CCharmapToUni::load_table(osfildef *fp)
{
    uchar buf[256];
    uint entry_cnt;

    /* read the header and the local table header */
    if (osfrb(fp, buf, 6))
        return;

    /* get the local table size from the local table header */
    entry_cnt = osrp2(buf + 4);

    /* read the mappings */
    while (entry_cnt > 0)
    {
        size_t cur;
        const uchar *p;

        /* figure out how many entries we can read this time */
        cur = sizeof(buf)/4;
        if (cur > entry_cnt)
            cur = entry_cnt;

        /* read the entries */
        if (osfrb(fp, buf, cur*4))
            return;

        /* deduct this number from the remaining count */
        entry_cnt -= cur;

        /* scan the entries */
        for (p = buf ; cur > 0 ; p += 4, --cur)
        {
            /* map this entry */
            set_mapping(osrp2(p), osrp2(p+2));
        }
    }
}